

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::addQueue(CLIntercept *this,cl_context context,cl_command_queue queue)

{
  mapped_type mVar1;
  list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_> *this_00;
  key_type *in_RDX;
  map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
  *in_RSI;
  long in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  
  if (in_RDX != (key_type *)0x0) {
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    mVar1 = *(int *)(in_RDI + 0x94a8) + 1;
    this_00 = (list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_> *)
              std::
              map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
              ::operator[](in_RSI,in_RDX);
    *(mapped_type *)
     &(this_00->super__List_base<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>)._M_impl
      ._M_node.super__List_node_base._M_next = mVar1;
    *(int *)(in_RDI + 0x94a8) = *(int *)(in_RDI + 0x94a8) + 1;
    std::
    map<_cl_context_*,_std::__cxx11::list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_std::__cxx11::list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>_>_>_>
    ::operator[]((map<_cl_context_*,_std::__cxx11::list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_std::__cxx11::list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>_>_>_>
                  *)in_RSI,(key_type *)in_RDX);
    std::__cxx11::list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>::push_back
              (this_00,(value_type *)CONCAT44(mVar1,in_stack_ffffffffffffffb8));
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20a9c6);
  }
  return;
}

Assistant:

void CLIntercept::addQueue(
    cl_context context,
    cl_command_queue queue )
{
    if( queue )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        m_QueueNumberMap[ queue ] = m_QueueNumber + 1;  // should be nonzero
        m_QueueNumber++;

        m_ContextQueuesMap[context].push_back(queue);
    }
}